

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  reference pbVar6;
  long lVar7;
  reference pcVar8;
  string *psVar9;
  string local_26d8 [32];
  undefined1 local_26b8 [8];
  ostringstream cmCTestLog_msg_17;
  string local_2540 [32];
  undefined1 local_2520 [8];
  ostringstream cmCTestLog_msg_16;
  string local_23a8 [32];
  undefined1 local_2388 [8];
  ostringstream cmCTestLog_msg_15;
  cmDuration local_2210;
  undefined1 local_2208 [8];
  cmXMLWriter xml;
  undefined1 local_2190 [8];
  ostringstream cmCTestLog_msg_14;
  undefined1 local_2018 [8];
  cmGeneratedFileStream xofs;
  cmCTestBuildErrorWarning *evit_1;
  iterator __end2_5;
  iterator __begin2_5;
  t_ErrorsAndWarningsVector *__range2_5;
  cmCTestBuildErrorWarning *evit;
  iterator __end2_4;
  iterator __begin2_4;
  t_ErrorsAndWarningsVector *__range2_4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1d88;
  type elapsed_build_time;
  string local_1d78;
  string local_1d58 [32];
  undefined1 local_1d38 [8];
  ostringstream cmCTestLog_msg_13;
  int local_1bc0;
  int local_1bbc;
  int res;
  int retVal;
  string local_1bb0;
  string local_1b90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b70;
  undefined1 local_1b50 [8];
  string bindirrep;
  string local_1b28;
  string local_1b08;
  undefined1 local_1ae8 [8];
  string bindir;
  string local_1ac0;
  string local_1aa0;
  string local_1a80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a60;
  undefined1 local_1a40 [8];
  string srcdirrep;
  string local_1a18;
  string local_19f8;
  undefined1 local_19d8 [8];
  string srcdir;
  string local_19b0;
  string local_1990;
  string local_1970 [32];
  undefined1 local_1950 [8];
  ostringstream cmCTestLog_msg_12;
  string *s_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  ostringstream local_1798 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1620 [32];
  undefined1 local_1600 [8];
  ostringstream cmCTestLog_msg_10;
  string *s_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  ostringstream local_1448 [8];
  ostringstream cmCTestLog_msg_9;
  string local_12d0 [32];
  undefined1 local_12b0 [8];
  ostringstream cmCTestLog_msg_8;
  string *s_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  ostringstream local_10f8 [8];
  ostringstream cmCTestLog_msg_7;
  string local_f80 [32];
  undefined1 local_f60 [8];
  ostringstream cmCTestLog_msg_6;
  string *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ostringstream local_da8 [8];
  ostringstream cmCTestLog_msg_5;
  long local_c30;
  size_type cc;
  undefined1 local_c08 [8];
  ostringstream cmCTestLog_msg_4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a90;
  time_point elapsed_time_start;
  cmGeneratedFileStream ofs;
  string local_838;
  string local_818;
  string *local_7f8;
  string *useLaunchers;
  undefined1 local_7d0 [8];
  ostringstream cmCTestLog_msg_3;
  allocator<char> local_651;
  string local_650;
  string local_630;
  string *local_610;
  string *buildDirectory;
  string local_600 [32];
  undefined1 local_5e0 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_468 [8];
  string makeCommand;
  undefined1 local_428 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_2b0 [8];
  cmCTestCompileErrorWarningRex r;
  int entry;
  duration<double,_std::ratio<1L,_1L>_> local_1c8;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestBuildHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Build project");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x11d,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  local_1c8.__r =
       (rep_conflict)cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  r.RegularExpression._204_4_ = 2;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
            ((duration<long,std::ratio<60l,1l>> *)&entry,(int *)&r.RegularExpression.field_0xcc);
  bVar2 = std::chrono::operator<(&local_1c8,(duration<long,_std::ratio<60L,_1L>_> *)&entry);
  if (bVar2) {
    this_local._4_4_ = 0;
  }
  else {
    r.RegularExpression.progsize = 0;
    while (cmCTestWarningErrorFileLine[r.RegularExpression.progsize].RegularExpressionString !=
           (char *)0x0) {
      cmCTestCompileErrorWarningRex::cmCTestCompileErrorWarningRex
                ((cmCTestCompileErrorWarningRex *)local_2b0);
      bVar2 = cmsys::RegularExpression::compile
                        ((RegularExpression *)&r,
                         cmCTestWarningErrorFileLine[r.RegularExpression.progsize].
                         RegularExpressionString);
      if (bVar2) {
        local_2b0._0_4_ = cmCTestWarningErrorFileLine[r.RegularExpression.progsize].FileIndex;
        local_2b0._4_4_ = cmCTestWarningErrorFileLine[r.RegularExpression.progsize].LineIndex;
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::push_back(&this->ErrorWarningFileLineRegex,(value_type *)local_2b0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
        poVar3 = std::operator<<((ostream *)local_428,"Problem Compiling regular expression: ");
        poVar3 = std::operator<<(poVar3,cmCTestWarningErrorFileLine[r.RegularExpression.progsize].
                                        RegularExpressionString);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x132,pcVar4,false);
        std::__cxx11::string::~string((string *)(makeCommand.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
      }
      cmCTestCompileErrorWarningRex::~cmCTestCompileErrorWarningRex
                ((cmCTestCompileErrorWarningRex *)local_2b0);
      r.RegularExpression.progsize = r.RegularExpression.progsize + 1;
    }
    GetMakeCommand_abi_cxx11_((string *)local_468,this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"BuildDirectory",&local_651);
      cmCTest::GetCTestConfiguration(&local_630,pcVar1,&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
      local_610 = &local_630;
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_838,"UseLaunchers",(allocator<char> *)&ofs.field_0x247);
        cmCTest::GetCTestConfiguration(&local_818,pcVar1,&local_838);
        std::__cxx11::string::~string((string *)&local_838);
        std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x247);
        local_7f8 = &local_818;
        bVar2 = cmSystemTools::IsOn(local_7f8);
        this->UseCTestLaunch = bVar2;
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&elapsed_time_start,None);
        local_a90.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        bVar2 = cmCTestGenericHandler::StartLogFile
                          (&this->super_cmCTestGenericHandler,"Build",
                           (cmGeneratedFileStream *)&elapsed_time_start);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c08);
          poVar3 = std::operator<<((ostream *)local_c08,"Cannot create build log file");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x151,pcVar4,false);
          std::__cxx11::string::~string((string *)&cc);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c08);
        }
        for (local_c30 = 0; cmCTestErrorMatches[local_c30] != (char *)0x0; local_c30 = local_c30 + 1
            ) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorMatches,cmCTestErrorMatches + local_c30);
        }
        for (local_c30 = 0; cmCTestErrorExceptions[local_c30] != (char *)0x0;
            local_c30 = local_c30 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorExceptions,cmCTestErrorExceptions + local_c30);
        }
        for (local_c30 = 0; cmCTestWarningMatches[local_c30] != (char *)0x0;
            local_c30 = local_c30 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningMatches,cmCTestWarningMatches + local_c30);
        }
        for (local_c30 = 0; cmCTestWarningExceptions[local_c30] != (char *)0x0;
            local_c30 = local_c30 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningExceptions,cmCTestWarningExceptions + local_c30);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream(local_da8);
        poVar3 = (ostream *)std::ostream::operator<<(local_da8,this);
        poVar3 = std::operator<<(poVar3,"Add this->ErrorMatchRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x175,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2);
        std::__cxx11::ostringstream::~ostringstream(local_da8);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->CustomErrorMatches);
        s = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->CustomErrorMatches);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&s), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f60);
          poVar3 = std::operator<<((ostream *)local_f60,"Add this->CustomErrorMatches: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x175,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_f80);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f60);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorMatchRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream(local_10f8);
        poVar3 = (ostream *)std::ostream::operator<<(local_10f8,this);
        poVar3 = std::operator<<(poVar3,"Add this->ErrorExceptionRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x177,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_1);
        std::__cxx11::ostringstream::~ostringstream(local_10f8);
        __end2_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomErrorExceptions);
        s_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomErrorExceptions);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_1), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12b0);
          poVar3 = std::operator<<((ostream *)local_12b0,"Add this->CustomErrorExceptions: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x177,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_12d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12b0);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorExceptionRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_1);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream(local_1448);
        poVar3 = (ostream *)std::ostream::operator<<(local_1448,this);
        poVar3 = std::operator<<(poVar3,"Add this->WarningMatchRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x179,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_2);
        std::__cxx11::ostringstream::~ostringstream(local_1448);
        __end2_2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomWarningMatches);
        s_2 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomWarningMatches);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_2,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_2), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1600);
          poVar3 = std::operator<<((ostream *)local_1600,"Add this->CustomWarningMatches: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x179,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1620);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1600);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningMatchRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_2);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream(local_1798);
        poVar3 = (ostream *)std::ostream::operator<<(local_1798,this);
        poVar3 = std::operator<<(poVar3,"Add this->WarningExceptionRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x17b,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_3);
        std::__cxx11::ostringstream::~ostringstream(local_1798);
        __end2_3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomWarningExceptions);
        s_3 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomWarningExceptions);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_3,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_3), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_3);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1950);
          poVar3 = std::operator<<((ostream *)local_1950,"Add this->CustomWarningExceptions: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x17b,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1970);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1950);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningExceptionRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_3);
        }
        std::__cxx11::string::clear();
        std::__cxx11::string::clear();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_19b0,"SourceDirectory",
                   (allocator<char> *)(srcdir.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_1990,pcVar1,&local_19b0);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_1990);
        std::__cxx11::string::~string((string *)&local_19b0);
        std::allocator<char>::~allocator((allocator<char> *)(srcdir.field_2._M_local_buf + 0xf));
        if (0x14 < uVar5) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a18,"SourceDirectory",
                     (allocator<char> *)(srcdirrep.field_2._M_local_buf + 0xf));
          cmCTest::GetCTestConfiguration(&local_19f8,pcVar1,&local_1a18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_19d8,&local_19f8,"/");
          std::__cxx11::string::~string((string *)&local_19f8);
          std::__cxx11::string::~string((string *)&local_1a18);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(srcdirrep.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string((string *)local_1a40);
          local_c30 = std::__cxx11::string::size();
          for (local_c30 = local_c30 + -2; local_c30 != 0; local_c30 = local_c30 + -1) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_19d8);
            if (*pcVar4 == '/') {
              lVar7 = std::__cxx11::string::c_str();
              std::__cxx11::string::operator=((string *)local_1a40,(char *)(lVar7 + local_c30));
              std::operator+(&local_1a60,"/...",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a40);
              std::__cxx11::string::operator=((string *)local_1a40,(string *)&local_1a60);
              std::__cxx11::string::~string((string *)&local_1a60);
              std::__cxx11::string::substr((ulong)local_1a80,(ulong)local_19d8);
              std::__cxx11::string::operator=((string *)local_19d8,local_1a80);
              std::__cxx11::string::~string(local_1a80);
              break;
            }
          }
          std::__cxx11::string::operator=((string *)&this->SimplifySourceDir,(string *)local_19d8);
          std::__cxx11::string::~string((string *)local_1a40);
          std::__cxx11::string::~string((string *)local_19d8);
        }
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1ac0,"BuildDirectory",
                   (allocator<char> *)(bindir.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_1aa0,pcVar1,&local_1ac0);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_1aa0);
        std::__cxx11::string::~string((string *)&local_1ac0);
        std::allocator<char>::~allocator((allocator<char> *)(bindir.field_2._M_local_buf + 0xf));
        if (0x14 < uVar5) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b28,"BuildDirectory",
                     (allocator<char> *)(bindirrep.field_2._M_local_buf + 0xf));
          cmCTest::GetCTestConfiguration(&local_1b08,pcVar1,&local_1b28);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1ae8,&local_1b08,"/");
          std::__cxx11::string::~string((string *)&local_1b08);
          std::__cxx11::string::~string((string *)&local_1b28);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(bindirrep.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string((string *)local_1b50);
          local_c30 = std::__cxx11::string::size();
          for (local_c30 = local_c30 + -2; local_c30 != 0; local_c30 = local_c30 + -1) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1ae8);
            if (*pcVar4 == '/') {
              lVar7 = std::__cxx11::string::c_str();
              std::__cxx11::string::operator=((string *)local_1b50,(char *)(lVar7 + local_c30));
              std::operator+(&local_1b70,"/...",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b50);
              std::__cxx11::string::operator=((string *)local_1b50,(string *)&local_1b70);
              std::__cxx11::string::~string((string *)&local_1b70);
              std::__cxx11::string::substr((ulong)local_1b90,(ulong)local_1ae8);
              std::__cxx11::string::operator=((string *)local_1ae8,local_1b90);
              std::__cxx11::string::~string(local_1b90);
              break;
            }
          }
          std::__cxx11::string::operator=((string *)&this->SimplifyBuildDir,(string *)local_1ae8);
          std::__cxx11::string::~string((string *)local_1b50);
          std::__cxx11::string::~string((string *)local_1ae8);
        }
        cmCTest::CurrentTime_abi_cxx11_(&local_1bb0,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)&local_1bb0);
        std::__cxx11::string::~string((string *)&local_1bb0);
        _res = std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = _res;
        local_1bbc = 0;
        local_1bc0 = 4;
        bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d38);
          poVar3 = std::operator<<((ostream *)local_1d38,"Build with command: ");
          poVar3 = std::operator<<(poVar3,(string *)local_468);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1aa,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1d58);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d38);
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          local_1bc0 = RunMakeCommand(this,(string *)local_468,&local_1bbc,pcVar4,0,
                                      (ostream *)&elapsed_time_start,Auto);
        }
        cmCTest::CurrentTime_abi_cxx11_(&local_1d78,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)&local_1d78);
        std::__cxx11::string::~string((string *)&local_1d78);
        elapsed_build_time.__r = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = elapsed_build_time.__r;
        __range2_4 = (t_ErrorsAndWarningsVector *)std::chrono::_V2::steady_clock::now();
        local_1d88.__r =
             (rep)std::chrono::operator-
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&__range2_4,&local_a90);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          __end2_4 = std::
                     vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                     ::begin(&this->ErrorsAndWarnings);
          evit = (cmCTestBuildErrorWarning *)
                 std::
                 vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                 ::end(&this->ErrorsAndWarnings);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_4,
                                    (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                                     *)&evit), bVar2) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator*(&__end2_4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->Text,pcVar4,"/.../");
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PreContext,pcVar4,"/.../");
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PostContext,pcVar4,"/.../");
            __gnu_cxx::
            __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
            ::operator++(&__end2_4);
          }
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          __end2_5 = std::
                     vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                     ::begin(&this->ErrorsAndWarnings);
          evit_1 = (cmCTestBuildErrorWarning *)
                   std::
                   vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ::end(&this->ErrorsAndWarnings);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_5,
                                    (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                                     *)&evit_1), bVar2) {
            xofs._576_8_ = __gnu_cxx::
                           __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                           ::operator*(&__end2_5);
            psVar9 = &((reference)xofs._576_8_)->Text;
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            psVar9 = (string *)(xofs._576_8_ + 0x70);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            psVar9 = (string *)(xofs._576_8_ + 0x90);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            __gnu_cxx::
            __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
            ::operator++(&__end2_5);
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2018,None);
        bVar2 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",
                           (cmGeneratedFileStream *)local_2018);
        if (bVar2) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2208,(ostream *)local_2018,0);
          GenerateXMLHeader(this,(cmXMLWriter *)local_2208);
          if ((this->UseCTestLaunch & 1U) == 0) {
            GenerateXMLLogScraped(this,(cmXMLWriter *)local_2208);
          }
          else {
            GenerateXMLLaunched(this,(cmXMLWriter *)local_2208);
          }
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<long,std::ratio<1l,1000000000l>,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_2210,&local_1d88);
          GenerateXMLFooter(this,(cmXMLWriter *)local_2208,local_2210);
          if (((local_1bc0 != 4) || (local_1bbc != 0)) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2388);
            poVar3 = std::operator<<((ostream *)local_2388,"Error(s) when building project");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1dc,pcVar4,false);
            std::__cxx11::string::~string(local_23a8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2388);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2520);
          poVar3 = std::operator<<((ostream *)local_2520,"   ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TotalErrors);
          pcVar4 = "";
          if (this->MaxErrors <= this->TotalErrors) {
            pcVar4 = " or more";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          poVar3 = std::operator<<(poVar3," Compiler errors");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e3,pcVar4,false);
          std::__cxx11::string::~string(local_2540);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2520);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_26b8);
          poVar3 = std::operator<<((ostream *)local_26b8,"   ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TotalWarnings);
          pcVar4 = "";
          if (this->MaxWarnings <= this->TotalWarnings) {
            pcVar4 = " or more";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          poVar3 = std::operator<<(poVar3," Compiler warnings");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e8,pcVar4,false);
          std::__cxx11::string::~string(local_26d8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_26b8);
          this_local._4_4_ = local_1bbc;
          buildDirectory._4_4_ = 1;
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2208);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2190);
          poVar3 = std::operator<<((ostream *)local_2190,"Cannot create build XML file");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ce,pcVar4,false);
          std::__cxx11::string::~string((string *)&xml.ElementOpen);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2190);
          this_local._4_4_ = -1;
          buildDirectory._4_4_ = 1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2018);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&elapsed_time_start);
        std::__cxx11::string::~string((string *)&local_818);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7d0);
        poVar3 = std::operator<<((ostream *)local_7d0,
                                 "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x144,pcVar4,false);
        std::__cxx11::string::~string((string *)&useLaunchers);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7d0);
        this_local._4_4_ = -1;
        buildDirectory._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)&local_630);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5e0);
      poVar3 = std::operator<<((ostream *)local_5e0,
                               "Cannot find MakeCommand key in the DartConfiguration.tcl");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x13b,pcVar4,false);
      std::__cxx11::string::~string(local_600);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5e0);
      this_local._4_4_ = -1;
      buildDirectory._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_468);
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmSystemTools::IsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    std::string srcdirrep;
    for (cc = srcdir.size() - 2; cc > 0; cc--) {
      if (srcdir[cc] == '/') {
        srcdirrep = srcdir.c_str() + cc;
        srcdirrep = "/..." + srcdirrep;
        srcdir = srcdir.substr(0, cc + 1);
        break;
      }
    }
    this->SimplifySourceDir = srcdir;
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    std::string bindirrep;
    for (cc = bindir.size() - 2; cc > 0; cc--) {
      if (bindir[cc] == '/') {
        bindirrep = bindir.c_str() + cc;
        bindirrep = "/..." + bindirrep;
        bindir = bindir.substr(0, cc + 1);
        break;
      }
    }
    this->SimplifyBuildDir = bindir;
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}